

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedBodyInertia.cpp
# Opt level: O1

ArticulatedBodyInertia *
iDynTree::ArticulatedBodyInertia::ABADyadHelperLin
          (ArticulatedBodyInertia *__return_storage_ptr__,SpatialForceVector *U,double inv_d,
          SpatialForceVector *param_3,double d_inv_d)

{
  double dVar1;
  SpatialVector<iDynTree::SpatialForceVector> *pSVar2;
  AngularVector3T *pAVar3;
  long lVar4;
  SpatialVector<iDynTree::SpatialForceVector> *pSVar5;
  AngularVector3T *pAVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  type tmp;
  double adStack_90 [4];
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_28;
  
  adStack_90[0] = 5.87071033342632e-318;
  local_38 = d_inv_d;
  local_28 = inv_d;
  ArticulatedBodyInertia(__return_storage_ptr__);
  pSVar2 = &U->super_SpatialVector<iDynTree::SpatialForceVector>;
  dVar7 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[0];
  dVar8 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[1];
  dVar10 = local_38 * dVar7;
  dVar11 = local_38 * dVar8;
  dVar9 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[2];
  dVar12 = dVar9 * local_38;
  lVar4 = 2;
  pSVar5 = pSVar2;
  do {
    dVar1 = (pSVar5->linearVec3).super_Vector3.m_data[0];
    adStack_90[lVar4] = dVar1 * dVar10;
    adStack_90[lVar4 + 1] = dVar1 * dVar11;
    adStack_90[lVar4 + 2] = dVar1 * dVar12;
    lVar4 = lVar4 + 3;
    pSVar5 = (SpatialVector<iDynTree::SpatialForceVector> *)
             ((pSVar5->linearVec3).super_Vector3.m_data + 1);
  } while (lVar4 != 0xb);
  dVar7 = dVar7 * local_28;
  dVar8 = dVar8 * local_28;
  dVar9 = dVar9 * local_28;
  lVar4 = 2;
  pSVar5 = pSVar2;
  do {
    dVar1 = (pSVar5->linearVec3).super_Vector3.m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar1 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar1 * dVar8;
    adStack_90[lVar4 + 2] = dVar1 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pSVar5 = (SpatialVector<iDynTree::SpatialForceVector> *)
             ((pSVar5->linearVec3).super_Vector3.m_data + 1);
  } while (lVar4 != 0xb);
  lVar4 = 2;
  do {
    dVar1 = (pSVar2->linearVec3).super_Vector3.m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar1 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar1 * dVar8;
    adStack_90[lVar4 + 2] = dVar1 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pSVar2 = (SpatialVector<iDynTree::SpatialForceVector> *)
             ((pSVar2->linearVec3).super_Vector3.m_data + 1);
  } while (lVar4 != 0xb);
  pAVar3 = &(U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3;
  (__return_storage_ptr__->linearLinear).m_data[0] = adStack_90[2];
  (__return_storage_ptr__->linearLinear).m_data[1] = local_68;
  (__return_storage_ptr__->linearLinear).m_data[2] = local_50;
  (__return_storage_ptr__->linearLinear).m_data[3] = adStack_90[3];
  (__return_storage_ptr__->linearLinear).m_data[4] = local_60;
  (__return_storage_ptr__->linearLinear).m_data[5] = local_48;
  (__return_storage_ptr__->linearLinear).m_data[6] = local_70;
  (__return_storage_ptr__->linearLinear).m_data[7] = local_58;
  (__return_storage_ptr__->linearLinear).m_data[8] = local_40;
  lVar4 = 2;
  pAVar6 = pAVar3;
  do {
    dVar1 = (pAVar6->super_Vector3).m_data[0];
    adStack_90[lVar4] = dVar1 * dVar10;
    adStack_90[lVar4 + 1] = dVar1 * dVar11;
    adStack_90[lVar4 + 2] = dVar1 * dVar12;
    lVar4 = lVar4 + 3;
    pAVar6 = (AngularVector3T *)((pAVar6->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  lVar4 = 2;
  pAVar6 = pAVar3;
  do {
    dVar10 = (pAVar6->super_Vector3).m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar10 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar10 * dVar8;
    adStack_90[lVar4 + 2] = dVar10 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pAVar6 = (AngularVector3T *)((pAVar6->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  lVar4 = 2;
  pAVar6 = pAVar3;
  do {
    dVar10 = (pAVar6->super_Vector3).m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar10 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar10 * dVar8;
    adStack_90[lVar4 + 2] = dVar10 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pAVar6 = (AngularVector3T *)((pAVar6->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  (__return_storage_ptr__->linearAngular).m_data[0] = adStack_90[2];
  (__return_storage_ptr__->linearAngular).m_data[1] = local_68;
  (__return_storage_ptr__->linearAngular).m_data[2] = local_50;
  (__return_storage_ptr__->linearAngular).m_data[3] = adStack_90[3];
  (__return_storage_ptr__->linearAngular).m_data[4] = local_60;
  (__return_storage_ptr__->linearAngular).m_data[5] = local_48;
  (__return_storage_ptr__->linearAngular).m_data[6] = local_70;
  (__return_storage_ptr__->linearAngular).m_data[7] = local_58;
  (__return_storage_ptr__->linearAngular).m_data[8] = local_40;
  dVar7 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[0]
  ;
  dVar8 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[1]
  ;
  dVar9 = (U->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[2]
  ;
  lVar4 = 2;
  pAVar6 = pAVar3;
  do {
    dVar10 = (pAVar6->super_Vector3).m_data[0];
    adStack_90[lVar4] = dVar10 * local_38 * dVar7;
    adStack_90[lVar4 + 1] = dVar10 * local_38 * dVar8;
    adStack_90[lVar4 + 2] = dVar10 * local_38 * dVar9;
    lVar4 = lVar4 + 3;
    pAVar6 = (AngularVector3T *)((pAVar6->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  dVar7 = local_28 * dVar7;
  dVar8 = local_28 * dVar8;
  dVar9 = dVar9 * local_28;
  lVar4 = 2;
  pAVar6 = pAVar3;
  do {
    dVar10 = (pAVar6->super_Vector3).m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar10 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar10 * dVar8;
    adStack_90[lVar4 + 2] = dVar10 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pAVar6 = (AngularVector3T *)((pAVar6->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  lVar4 = 2;
  do {
    dVar10 = (pAVar3->super_Vector3).m_data[0];
    adStack_90[lVar4] = adStack_90[lVar4] + dVar10 * dVar7;
    adStack_90[lVar4 + 1] = adStack_90[lVar4 + 1] + dVar10 * dVar8;
    adStack_90[lVar4 + 2] = dVar10 * dVar9 + adStack_90[lVar4 + 2];
    lVar4 = lVar4 + 3;
    pAVar3 = (AngularVector3T *)((pAVar3->super_Vector3).m_data + 1);
  } while (lVar4 != 0xb);
  (__return_storage_ptr__->angularAngular).m_data[0] = adStack_90[2];
  (__return_storage_ptr__->angularAngular).m_data[1] = local_68;
  (__return_storage_ptr__->angularAngular).m_data[2] = local_50;
  (__return_storage_ptr__->angularAngular).m_data[3] = adStack_90[3];
  (__return_storage_ptr__->angularAngular).m_data[4] = local_60;
  (__return_storage_ptr__->angularAngular).m_data[5] = local_48;
  (__return_storage_ptr__->angularAngular).m_data[6] = local_70;
  (__return_storage_ptr__->angularAngular).m_data[7] = local_58;
  (__return_storage_ptr__->angularAngular).m_data[8] = local_40;
  return __return_storage_ptr__;
}

Assistant:

ArticulatedBodyInertia ArticulatedBodyInertia::ABADyadHelperLin(const SpatialForceVector& U, const double inv_d,
                                                                const SpatialForceVector& /*dU*/, const double d_inv_d)
{
    ArticulatedBodyInertia ret;

    Eigen::Map<const Eigen::Vector3d> Ulin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> Uang(U.getAngularVec3().data());

    Eigen::Map<const Eigen::Vector3d> dUlin(U.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> dUang(U.getAngularVec3().data());

    toEigen(ret.getLinearLinearSubmatrix()) =   (d_inv_d*Ulin)*Ulin.transpose()
                                              + (inv_d*dUlin)*Ulin.transpose()
                                              + (inv_d*Ulin)*dUlin.transpose();
    toEigen(ret.getLinearAngularSubmatrix()) =  (d_inv_d*Ulin)*Uang.transpose()
                                              + (inv_d*dUlin)*Uang.transpose()
                                              + (inv_d*Ulin)*dUang.transpose();
    toEigen(ret.getAngularAngularSubmatrix()) = (d_inv_d*Uang)*Uang.transpose()
                                              + (inv_d*dUang)*Uang.transpose()
                                              + (inv_d*Uang)*dUang.transpose();

    return ret;
}